

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O0

void xSAT_SolverRebuildOrderHeap(xSAT_Solver_t *s)

{
  char cVar1;
  int iVar2;
  Vec_Int_t *Vars;
  int local_1c;
  int Var;
  Vec_Int_t *vTemp;
  xSAT_Solver_t *s_local;
  
  iVar2 = Vec_StrSize(s->vAssigns);
  Vars = Vec_IntAlloc(iVar2);
  local_1c = 0;
  while( true ) {
    iVar2 = Vec_StrSize(s->vAssigns);
    if (iVar2 <= local_1c) break;
    cVar1 = Vec_StrEntry(s->vAssigns,local_1c);
    if (cVar1 == '\x03') {
      Vec_IntPush(Vars,local_1c);
    }
    local_1c = local_1c + 1;
  }
  xSAT_HeapBuild(s->hOrder,Vars);
  Vec_IntFree(Vars);
  return;
}

Assistant:

void xSAT_SolverRebuildOrderHeap( xSAT_Solver_t * s )
{
    Vec_Int_t * vTemp = Vec_IntAlloc( Vec_StrSize( s->vAssigns ) );
    int Var;

    for ( Var = 0; Var < Vec_StrSize( s->vAssigns ); Var++ )
        if ( Vec_StrEntry( s->vAssigns, Var ) == VarX )
            Vec_IntPush( vTemp, Var );

    xSAT_HeapBuild( s->hOrder, vTemp );
    Vec_IntFree( vTemp );
}